

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O2

void __thiscall
Assimp::BlenderImporter::ResolveImage
          (BlenderImporter *this,aiMaterial *out,Material *mat,MTex *tex,Image *img,
          ConversionData *conv_data)

{
  MapType MVar1;
  uint index;
  aiTexture *paVar2;
  aiMaterial *this_00;
  long lVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  undefined8 *puVar7;
  size_t sVar8;
  long lVar9;
  char *pcVar10;
  aiTexel *out_00;
  char *pcVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> local_889;
  aiMaterial *local_888;
  MTex *local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  format local_838 [2];
  aiString name;
  
  name.length = 0;
  name.data[0] = '\0';
  local_888 = out;
  local_880 = tex;
  memset(name.data + 1,0x1b,0x3ff);
  if ((img->packedfile).super___shared_ptr<Assimp::Blender::PackedFile,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    this_01 = &local_878;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this_01,img->name,(allocator<char> *)&local_858);
    sVar8 = 0x3ff;
    if ((local_878._M_string_length & 0xfffffc00) == 0) {
      sVar8 = local_878._M_string_length & 0xffffffff;
    }
    memcpy(&local_838[0].field_0x4,local_878._M_dataplus._M_p,sVar8);
    (&local_838[0].field_0x4)[sVar8] = 0;
    name.length = (ai_uint32)sVar8;
    memcpy(name.data,&local_838[0].field_0x4,sVar8);
    name.data[sVar8] = '\0';
  }
  else {
    name.data[0] = '*';
    uVar5 = ASSIMP_itoa10(name.data + 1,0x3ff,
                          (int32_t)((ulong)((long)(conv_data->textures).arr.
                                                  super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(conv_data->textures).arr.
                                                 super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 3));
    name.length = uVar5 + 1;
    puVar7 = (undefined8 *)operator_new(0x428);
    *puVar7 = 0;
    puVar7[3] = 0;
    *(undefined4 *)(puVar7 + 4) = 0;
    *(undefined1 *)((long)puVar7 + 0x24) = 0;
    memset((void *)((long)puVar7 + 0x25),0x1b,0x3ff);
    *(undefined4 *)(puVar7 + 1) = 0;
    local_838[0]._0_8_ = puVar7;
    std::vector<aiTexture*,std::allocator<aiTexture*>>::emplace_back<aiTexture*>
              ((vector<aiTexture*,std::allocator<aiTexture*>> *)&conv_data->textures,
               (aiTexture **)local_838);
    paVar2 = (conv_data->textures).arr.super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1];
    sVar8 = strlen(img->name);
    pcVar11 = img->name + sVar8;
    lVar3 = sVar8 + 0x42b;
    do {
      lVar9 = lVar3;
      if (lVar9 + -3 < 0x428) break;
      lVar3 = lVar9 + -1;
    } while ((img->id).name[lVar9 + -0x23] != '.');
    pcVar10 = (img->id).name + lVar9 + -0x22;
    if (pcVar11 < pcVar10) {
      cVar4 = '\0';
    }
    else {
      iVar6 = tolower((int)*pcVar10);
      cVar4 = (char)iVar6;
    }
    paVar2->achFormatHint[0] = cVar4;
    pcVar10 = (img->id).name + lVar9 + -0x21;
    if (pcVar11 < pcVar10) {
      cVar4 = '\0';
    }
    else {
      iVar6 = tolower((int)*pcVar10);
      cVar4 = (char)iVar6;
    }
    paVar2->achFormatHint[1] = cVar4;
    pcVar10 = (img->id).name + lVar9 + -0x20;
    if (pcVar11 < pcVar10) {
      cVar4 = '\0';
    }
    else {
      iVar6 = tolower((int)*pcVar10);
      cVar4 = (char)iVar6;
    }
    paVar2->achFormatHint[2] = cVar4;
    paVar2->achFormatHint[3] = '\0';
    uVar5 = ((img->packedfile).
             super___shared_ptr<Assimp::Blender::PackedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            size;
    paVar2->mWidth = uVar5;
    out_00 = (aiTexel *)operator_new__((ulong)uVar5);
    StreamReader<true,_true>::SetCurrentPos
              ((conv_data->db->reader).
               super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,((((img->packedfile).
                         super___shared_ptr<Assimp::Blender::PackedFile,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->data).
                       super___shared_ptr<Assimp::Blender::FileOffset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->val);
    StreamReader<true,_true>::CopyAndAdvance
              ((conv_data->db->reader).
               super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,out_00,(ulong)paVar2->mWidth);
    paVar2->pcData = out_00;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_858,img->name,&local_889);
    std::operator+(&local_878,"Reading embedded texture, original file was ",&local_858);
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_838,
               &local_878);
    LogFunctions<Assimp::BlenderImporter>::LogInfo(local_838);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_838);
    std::__cxx11::string::~string((string *)&local_878);
    this_01 = &local_858;
  }
  std::__cxx11::string::~string((string *)this_01);
  this_00 = local_888;
  MVar1 = local_880->mapto;
  if ((MVar1 & MapType_COL) == 0) {
    if ((MVar1 & MapType_NORM) == 0) {
      if ((MVar1 & MapType_COLSPEC) == 0) {
        if ((MVar1 & MapType_COLMIR) == 0) {
          if ((MVar1 & MapType_SPEC) == 0) {
            if ((MVar1 & MapType_EMIT) == 0) {
              if ((MVar1 >> 0xb & 1) == 0) {
                uVar5 = (uint)((MVar1 >> 0xc & 1) == 0) * 9 + 9;
              }
              else {
                uVar5 = 3;
              }
            }
            else {
              uVar5 = 4;
            }
          }
          else {
            uVar5 = 7;
          }
        }
        else {
          uVar5 = 0xb;
        }
      }
      else {
        uVar5 = 2;
      }
    }
    else {
      uVar5 = ((((local_880->tex).
                 super___shared_ptr<Assimp::Blender::Tex,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                imaflag >> 0xb & 1) != 0) + 5;
      aiMaterial::AddProperty(local_888,&local_880->norfac,1,"$mat.bumpscaling",0,0);
    }
  }
  else {
    uVar5 = 1;
  }
  index = conv_data->next_texture[uVar5];
  conv_data->next_texture[uVar5] = index + 1;
  aiMaterial::AddProperty(this_00,&name,"$tex.file",uVar5,index);
  return;
}

Assistant:

void BlenderImporter::ResolveImage(aiMaterial* out, const Material* mat, const MTex* tex, const Image* img, ConversionData& conv_data)
{
    (void)mat; (void)tex; (void)conv_data;
    aiString name;

    // check if the file contents are bundled with the BLEND file
    if (img->packedfile) {
        name.data[0] = '*';
        name.length = 1+ ASSIMP_itoa10(name.data+1,static_cast<unsigned int>(MAXLEN-1), static_cast<int32_t>(conv_data.textures->size()));

        conv_data.textures->push_back(new aiTexture());
        aiTexture* tex = conv_data.textures->back();

        // usually 'img->name' will be the original file name of the embedded textures,
        // so we can extract the file extension from it.
        const size_t nlen = strlen( img->name );
        const char* s = img->name+nlen, *e = s;
        while ( s >= img->name && *s != '.' ) {
            --s;
        }

        tex->achFormatHint[0] = s+1>e ? '\0' : ::tolower( s[1] );
        tex->achFormatHint[1] = s+2>e ? '\0' : ::tolower( s[2] );
        tex->achFormatHint[2] = s+3>e ? '\0' : ::tolower( s[3] );
        tex->achFormatHint[3] = '\0';

        // tex->mHeight = 0;
        tex->mWidth = img->packedfile->size;
        uint8_t* ch = new uint8_t[tex->mWidth];

        conv_data.db.reader->SetCurrentPos(static_cast<size_t>( img->packedfile->data->val));
        conv_data.db.reader->CopyAndAdvance(ch,tex->mWidth);

        tex->pcData = reinterpret_cast<aiTexel*>(ch);

        LogInfo("Reading embedded texture, original file was "+std::string(img->name));
    } else {
        name = aiString( img->name );
    }

    aiTextureType texture_type = aiTextureType_UNKNOWN;
    MTex::MapType map_type = tex->mapto;

    if (map_type & MTex::MapType_COL)
        texture_type = aiTextureType_DIFFUSE;
    else if (map_type & MTex::MapType_NORM) {
        if (tex->tex->imaflag & Tex::ImageFlags_NORMALMAP) {
            texture_type = aiTextureType_NORMALS;
        }
        else {
            texture_type = aiTextureType_HEIGHT;
        }
        out->AddProperty(&tex->norfac,1,AI_MATKEY_BUMPSCALING);
    }
    else if (map_type & MTex::MapType_COLSPEC)
        texture_type = aiTextureType_SPECULAR;
    else if (map_type & MTex::MapType_COLMIR)
        texture_type = aiTextureType_REFLECTION;
    //else if (map_type & MTex::MapType_REF)
    else if (map_type & MTex::MapType_SPEC)
        texture_type = aiTextureType_SHININESS;
    else if (map_type & MTex::MapType_EMIT)
        texture_type = aiTextureType_EMISSIVE;
    //else if (map_type & MTex::MapType_ALPHA)
    //else if (map_type & MTex::MapType_HAR)
    //else if (map_type & MTex::MapType_RAYMIRR)
    //else if (map_type & MTex::MapType_TRANSLU)
    else if (map_type & MTex::MapType_AMB)
        texture_type = aiTextureType_AMBIENT;
    else if (map_type & MTex::MapType_DISPLACE)
        texture_type = aiTextureType_DISPLACEMENT;
    //else if (map_type & MTex::MapType_WARP)

    out->AddProperty(&name,AI_MATKEY_TEXTURE(texture_type,
        conv_data.next_texture[texture_type]++));

}